

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigObj.c
# Opt level: O2

void Aig_ObjPatchFanin0(Aig_Man_t *p,Aig_Obj_t *pObj,Aig_Obj_t *pFaninNew)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pObj_00;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigObj.c"
                  ,0x11d,"void Aig_ObjPatchFanin0(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if ((*(uint *)&pObj->field_0x18 & 7) == 3) {
    pObj_00 = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
    if (p->pFanData != (int *)0x0) {
      Aig_ObjRemoveFanout(p,pObj_00,pObj);
    }
    Aig_ObjDeref(pObj_00);
    pObj->pFanin0 = pFaninNew;
    uVar2 = Aig_ObjLevelNew(pObj);
    uVar4 = (ulong)(uVar2 & 0xffffff) << 0x20;
    uVar1 = *(ulong *)&pObj->field_0x18;
    *(ulong *)&pObj->field_0x18 = uVar1 & 0xff000000ffffffff | uVar4;
    pAVar6 = pObj->pFanin0;
    if (pAVar6 == (Aig_Obj_t *)0x0) {
      uVar5 = 8;
    }
    else {
      uVar5 = (ulong)(((int)pAVar6 * 8 ^ *(uint *)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x18)) & 8
                     );
    }
    *(ulong *)&pObj->field_0x18 = uVar1 & 0xff000000fffffff7 | uVar4 | uVar5;
    if (p->pFanData != (int *)0x0) {
      Aig_ObjAddFanout(p,(Aig_Obj_t *)((ulong)pAVar6 & 0xfffffffffffffffe),pObj);
      pAVar6 = pObj->pFanin0;
    }
    uVar1 = *(ulong *)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x18);
    *(ulong *)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x18) =
         uVar1 & 0xffffffff0000003f | (ulong)((int)uVar1 + 0x40U & 0xffffffc0);
    if ((*(uint *)&pObj_00->field_0x18 & 7) != 2) {
      iVar3 = Aig_ObjIsConst1(pObj_00);
      if ((iVar3 == 0) && ((*(uint *)&pObj_00->field_0x18 & 0xffffffc0) == 0)) {
        Aig_ObjDelete_rec(p,pObj_00,1);
        return;
      }
    }
    return;
  }
  __assert_fail("Aig_ObjIsCo(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigObj.c"
                ,0x11e,"void Aig_ObjPatchFanin0(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
}

Assistant:

void Aig_ObjPatchFanin0( Aig_Man_t * p, Aig_Obj_t * pObj, Aig_Obj_t * pFaninNew )
{
    Aig_Obj_t * pFaninOld;
    assert( !Aig_IsComplement(pObj) );
    assert( Aig_ObjIsCo(pObj) );
    pFaninOld = Aig_ObjFanin0(pObj);
    // decrement ref and remove fanout
    if ( p->pFanData )
        Aig_ObjRemoveFanout( p, pFaninOld, pObj );
    Aig_ObjDeref( pFaninOld );
    // update the fanin
    pObj->pFanin0 = pFaninNew;
    pObj->Level = Aig_ObjLevelNew( pObj );
    pObj->fPhase = Aig_ObjPhaseReal(pObj->pFanin0);
    // increment ref and add fanout
    if ( p->pFanData )
        Aig_ObjAddFanout( p, Aig_ObjFanin0(pObj), pObj );
    Aig_ObjRef( Aig_ObjFanin0(pObj) );
    // get rid of old fanin
    if ( !Aig_ObjIsCi(pFaninOld) && !Aig_ObjIsConst1(pFaninOld) && Aig_ObjRefs(pFaninOld) == 0 )
        Aig_ObjDelete_rec( p, pFaninOld, 1 );
}